

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

EVaction INT_EVassoc_split_action(CManager_conflict cm,EVstone stone_num,EVstone *target_stone_list)

{
  void **ppvVar1;
  undefined8 *puVar2;
  attr_list *pp_Var3;
  event_path_data evp;
  int iVar4;
  stone_type stone;
  _proto_action *p_Var5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  
  evp = cm->evp;
  stone = stone_struct(evp,stone_num);
  if (stone == (stone_type)0x0) {
    uVar10 = 0xffffffff;
  }
  else {
    uVar10 = stone->proto_action_count;
    lVar7 = (long)(int)uVar10;
    p_Var5 = (_proto_action *)INT_CMrealloc(stone->proto_actions,lVar7 * 0x60 + 0x60);
    stone->proto_actions = p_Var5;
    *(undefined8 *)(p_Var5 + lVar7) = 0;
    p_Var5[lVar7].input_format_requirements = (FMStructDescList)0x0;
    p_Var5[lVar7].matching_reference_formats = (FMFormat *)0x0;
    (((anon_union_48_6_c1ce387a_for_o *)(&p_Var5[lVar7].matching_reference_formats + 1))->term).
    handler = (EVSimpleHandlerFunc)0x0;
    ppvVar1 = &p_Var5[lVar7].o.term.client_data;
    *ppvVar1 = (void *)0x0;
    ppvVar1[1] = (void *)0x0;
    puVar2 = (undefined8 *)((long)&p_Var5[lVar7].o + 0x18);
    *puVar2 = 0;
    puVar2[1] = 0;
    pp_Var3 = &p_Var5[lVar7].o.bri.remote_contact;
    *pp_Var3 = (attr_list)0x0;
    pp_Var3[1] = (attr_list)0x0;
    p_Var5[lVar7].attrs = (attr_list)0x0;
    (&p_Var5[lVar7].attrs)[1] = (attr_list)0x0;
    stone->proto_actions[lVar7].action_type = Action_Split;
    for (uVar9 = 0; (target_stone_list != (EVstone *)0x0 && (target_stone_list[uVar9] != -1));
        uVar9 = uVar9 + 1) {
    }
    iVar8 = (int)uVar9;
    iVar4 = CMtrace_val[10];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(cm,EVerbose);
    }
    if (iVar4 != 0) {
      fprintf((FILE *)cm->CMTrace_file,"Adding Split action %d to ",(ulong)uVar10);
      fprint_stone_identifier(cm->CMTrace_file,evp,stone_num);
      fprintf((FILE *)cm->CMTrace_file,", %d target stones -> ",uVar9 & 0xffffffff);
      if (iVar8 != 0) {
        uVar6 = 0;
        do {
          fprintf((FILE *)cm->CMTrace_file,"%x, ",(ulong)(uint)target_stone_list[uVar6]);
          uVar6 = uVar6 + 1;
        } while ((uVar9 & 0xffffffff) != uVar6);
      }
      fputc(10,(FILE *)cm->CMTrace_file);
    }
    if (iVar8 != 0) {
      uVar6 = 0;
      do {
        INT_EVstone_add_split_target(cm,stone_num,target_stone_list[uVar6]);
        uVar6 = uVar6 + 1;
      } while ((uVar9 & 0xffffffff) != uVar6);
    }
    stone->output_count = iVar8;
    stone->default_action = uVar10;
    stone->proto_action_count = stone->proto_action_count + 1;
    stone->response_cache_count = 0;
    if (stone->response_cache != (response_cache_element *)0x0) {
      free_response_cache(stone);
    }
    stone->response_cache = (response_cache_element *)0x0;
  }
  return uVar10;
}

Assistant:

extern EVaction
INT_EVassoc_split_action(CManager cm, EVstone stone_num, 
		     EVstone *target_stone_list)
{
    event_path_data evp = cm->evp;
    stone_type stone;
    int action_num;
    int target_count = 0, i;

    stone = stone_struct(evp, stone_num);
    if (!stone) return -1;

    action_num = stone->proto_action_count;
    stone->proto_actions = realloc(stone->proto_actions, 
				   (action_num + 1) * 
				   sizeof(stone->proto_actions[0]));
    memset(&stone->proto_actions[action_num], 0, 
	   sizeof(stone->proto_actions[0]));
    stone->proto_actions[action_num].action_type = Action_Split;
    while (target_stone_list && (target_stone_list[target_count] != -1)) {
	target_count++;
    }
    if (CMtrace_on(cm, EVerbose)) {
	fprintf(cm->CMTrace_file, "Adding Split action %d to ", action_num);
	fprint_stone_identifier(cm->CMTrace_file, evp, stone_num);
	fprintf(cm->CMTrace_file, ", %d target stones -> ", target_count);
	for (i=0; i < target_count; i++) {
	    fprintf(cm->CMTrace_file, "%x, ", target_stone_list[i]);
	}
	fprintf(cm->CMTrace_file, "\n");
    }
    for (i=0; i < target_count; i++) {
	INT_EVstone_add_split_target(cm, stone_num, target_stone_list[i]);
    }
    stone->output_count = target_count;
    stone->default_action = action_num;
    stone->proto_action_count++;
    clear_response_cache(stone);
    return action_num;
}